

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * stripPrefix(string *__return_storage_ptr__,string *value,string *prefix)

{
  bool bVar1;
  size_type __n;
  __sv_type __x;
  string *prefix_local;
  string *value_local;
  string *strippedValue;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,value);
  __x = std::__cxx11::string::operator_cast_to_basic_string_view((string *)prefix);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with(__return_storage_ptr__,__x);
  if (bVar1) {
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (prefix);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (__return_storage_ptr__,0,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string stripPrefix( std::string const & value, std::string const & prefix )
{
  std::string strippedValue = value;
  if ( strippedValue.starts_with( prefix ) )
  {
    strippedValue.erase( 0, prefix.length() );
  }
  return strippedValue;
}